

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::EarlyFragmentTestsCase::init
          (EarlyFragmentTestsCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ContextInfo *pCVar4;
  NotSupportedError *pNVar5;
  RenderContext *pRVar6;
  RenderTarget *pRVar7;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c2;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  deUint32 local_50;
  ContextType local_4c;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  EarlyFragmentTestsCase *local_10;
  EarlyFragmentTestsCase *this_local;
  
  local_10 = this;
  pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  iVar2 = (*pCVar4->_vptr_ContextInfo[2])(pCVar4,0x90ce);
  if (iVar2 == 0) {
    local_45 = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_MAX_FRAGMENT_IMAGE_UNIFORMS is zero",&local_31);
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_30);
    local_45 = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_OES_shader_image_atomic");
  if (!bVar1) {
    pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    local_4c.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
    local_50 = (deUint32)glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(local_4c,(ApiType)local_50);
    if (!bVar1) {
      local_72 = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Test requires OES_shader_image_atomic extension",&local_71);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_70);
      local_72 = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if ((this->m_type == TESTTYPE_DEPTH) && (this->m_renderTarget == RENDERTARGET_DEFAULT)) {
    pRVar7 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = tcu::RenderTarget::getDepthBits(pRVar7);
    if (iVar2 == 0) {
      local_9a = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Test requires depth buffer",&local_99);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_98);
      local_9a = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if ((this->m_type == TESTTYPE_STENCIL) && (this->m_renderTarget == RENDERTARGET_DEFAULT)) {
    pRVar7 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = tcu::RenderTarget::getStencilBits(pRVar7);
    if (iVar2 == 0) {
      local_c2 = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Test requires stencil buffer",&local_c1);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_c0);
      local_c2 = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    pRVar7 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = tcu::RenderTarget::getWidth(pRVar7);
    if (0x1f < iVar2) {
      pRVar7 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
      uVar3 = tcu::RenderTarget::getHeight(pRVar7);
      this = (EarlyFragmentTestsCase *)(ulong)uVar3;
      if (0x1f < (int)uVar3) goto LAB_02107193;
    }
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_128,
                      &Functional::(anonymous_namespace)::EarlyFragmentTestsCase::RENDER_SIZE);
    std::operator+(&local_108,"Render target must have at least ",&local_128);
    std::operator+(&local_e8,&local_108," width and height");
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_e8);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
LAB_02107193:
  return (int)this;
}

Assistant:

void init (void)
	{
		if (m_context.getContextInfo().getInt(GL_MAX_FRAGMENT_IMAGE_UNIFORMS) == 0)
			throw tcu::NotSupportedError("GL_MAX_FRAGMENT_IMAGE_UNIFORMS is zero");

		if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
			throw tcu::NotSupportedError("Test requires OES_shader_image_atomic extension");

		if (m_type == TESTTYPE_DEPTH				&&
			m_renderTarget == RENDERTARGET_DEFAULT	&&
			m_context.getRenderTarget().getDepthBits() == 0)
		{
			throw tcu::NotSupportedError("Test requires depth buffer");
		}

		if (m_type == TESTTYPE_STENCIL				&&
			m_renderTarget == RENDERTARGET_DEFAULT	&&
			m_context.getRenderTarget().getStencilBits() == 0)
		{
			throw tcu::NotSupportedError("Test requires stencil buffer");
		}

		if (m_renderTarget == RENDERTARGET_DEFAULT	&&
			(m_context.getRenderTarget().getWidth() < RENDER_SIZE || m_context.getRenderTarget().getHeight() < RENDER_SIZE))
			throw tcu::NotSupportedError("Render target must have at least " + toString(RENDER_SIZE) + " width and height");
	}